

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_context_get_device_info__pulse
                    (ma_context *pContext,ma_device_type deviceType,ma_device_id *pDeviceID,
                    ma_device_info_conflict *pDeviceInfo)

{
  ma_device_id *local_50;
  char *pDeviceName;
  ma_pa_operation *pOP;
  ma_context_get_device_info_callback_data__pulse callbackData;
  ma_result result;
  ma_device_info_conflict *pDeviceInfo_local;
  ma_device_id *pDeviceID_local;
  ma_device_type deviceType_local;
  ma_context *pContext_local;
  
  callbackData.foundDevice = 0;
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x4589,
                  "ma_result ma_context_get_device_info__pulse(ma_context *, ma_device_type, const ma_device_id *, ma_device_info *)"
                 );
  }
  callbackData.pDeviceInfo._4_4_ = 0;
  local_50 = pDeviceID;
  if (pDeviceID == (ma_device_id *)0x0) {
    local_50 = (ma_device_id *)0x0;
  }
  pOP = (ma_pa_operation *)pDeviceInfo;
  callbackData.foundDevice =
       ma_context_get_default_device_index__pulse(pContext,deviceType,(ma_uint32 *)&callbackData);
  if (deviceType == ma_device_type_playback) {
    pDeviceName = (char *)(*(pContext->field_14).alsa.snd_pcm_hw_params_test_channels)
                                    ((pContext->field_14).alsa.snd_pcm_poll_descriptors,local_50,
                                     ma_context_get_device_info_sink_callback__pulse,&pOP);
  }
  else {
    pDeviceName = (char *)(*(pContext->field_14).alsa.snd_pcm_hw_params_test_rate)
                                    ((pContext->field_14).alsa.snd_pcm_poll_descriptors,local_50,
                                     ma_context_get_device_info_source_callback__pulse,&pOP);
  }
  if (pDeviceName == (char *)0x0) {
    callbackData.foundDevice = 0xffffffff;
  }
  else {
    ma_wait_for_operation_and_unref__pulse
              (pContext,(pContext->field_14).pulse.pMainLoop,(ma_pa_operation *)pDeviceName);
    if (callbackData.pDeviceInfo._4_4_ == 0) {
      callbackData.foundDevice = 0xffffff98;
    }
  }
  return callbackData.foundDevice;
}

Assistant:

static ma_result ma_context_get_device_info__pulse(ma_context* pContext, ma_device_type deviceType, const ma_device_id* pDeviceID, ma_device_info* pDeviceInfo)
{
    ma_result result = MA_SUCCESS;
    ma_context_get_device_info_callback_data__pulse callbackData;
    ma_pa_operation* pOP = NULL;
    const char* pDeviceName = NULL;

    MA_ASSERT(pContext != NULL);

    callbackData.pDeviceInfo = pDeviceInfo;
    callbackData.foundDevice = MA_FALSE;

    if (pDeviceID != NULL) {
        pDeviceName = pDeviceID->pulse;
    } else {
        pDeviceName = NULL;
    }

    result = ma_context_get_default_device_index__pulse(pContext, deviceType, &callbackData.defaultDeviceIndex);

    if (deviceType == ma_device_type_playback) {
        pOP = ((ma_pa_context_get_sink_info_by_name_proc)pContext->pulse.pa_context_get_sink_info_by_name)((ma_pa_context*)(pContext->pulse.pPulseContext), pDeviceName, ma_context_get_device_info_sink_callback__pulse, &callbackData);
    } else {
        pOP = ((ma_pa_context_get_source_info_by_name_proc)pContext->pulse.pa_context_get_source_info_by_name)((ma_pa_context*)(pContext->pulse.pPulseContext), pDeviceName, ma_context_get_device_info_source_callback__pulse, &callbackData);
    }

    if (pOP != NULL) {
        ma_wait_for_operation_and_unref__pulse(pContext, pContext->pulse.pMainLoop, pOP);
    } else {
        result = MA_ERROR;
        goto done;
    }

    if (!callbackData.foundDevice) {
        result = MA_NO_DEVICE;
        goto done;
    }

done:
    return result;
}